

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_function.h
# Opt level: O0

type dukglue::detail::FuncInfoHolder<std::__cxx11::string>::FuncRuntime::
     actually_call<std::__cxx11::string>
               (duk_context *ctx,
               _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *funcToCall,
               tuple<> *args)

{
  tuple<> *in_RCX;
  string local_60;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> return_val;
  tuple<> *args_local;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *funcToCall_local;
  duk_context *ctx_local;
  
  return_val.field_2._8_8_ = args;
  apply_fp<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (detail *)funcToCall,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,in_RCX)
  ;
  std::__cxx11::string::string((string *)&local_60,(string *)local_40);
  types::DukType<std::__cxx11::string>::push<std::__cxx11::string>(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static typename std::enable_if<!std::is_void<Dummy>::value>::type actually_call(duk_context* ctx, RetType(*funcToCall)(Ts...), const std::tuple<BakedTs...>& args)
				{
					// ArgStorage has some static_asserts in it that validate value types,
					// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
					typedef typename dukglue::types::ArgStorage<RetType>::type ValidateReturnType;

					RetType return_val = dukglue::detail::apply_fp(funcToCall, args);

					using namespace dukglue::types;
					DukType<typename Bare<RetType>::type>::template push<RetType>(ctx, std::move(return_val));
				}